

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_internal.h
# Opt level: O2

void absl::lts_20250127::cord_internal::SmallMemmove<true>(char *dst,char *src,size_t n)

{
  char *pcVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  
  if (n < 8) {
    if (3 < n) {
      uVar2 = *(undefined4 *)src;
      uVar3 = *(undefined4 *)(src + (n - 4));
      dst[4] = '\0';
      dst[5] = '\0';
      dst[6] = '\0';
      dst[7] = '\0';
      dst[7] = '\0';
      dst[8] = '\0';
      dst[9] = '\0';
      dst[10] = '\0';
      dst[0xb] = '\0';
      dst[0xc] = '\0';
      dst[0xd] = '\0';
      dst[0xe] = '\0';
      *(undefined4 *)dst = uVar2;
      *(undefined4 *)(dst + (n - 4)) = uVar3;
      return;
    }
    if (n != 0) {
      *dst = *src;
      dst[n >> 1] = src[n >> 1];
      dst[n - 1] = src[n - 1];
    }
    dst[7] = '\0';
    dst[8] = '\0';
    dst[9] = '\0';
    dst[10] = '\0';
    dst[0xb] = '\0';
    dst[0xc] = '\0';
    dst[0xd] = '\0';
    dst[0xe] = '\0';
    pcVar1 = dst + n;
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
    pcVar1[4] = '\0';
    pcVar1[5] = '\0';
    pcVar1[6] = '\0';
    pcVar1[7] = '\0';
    return;
  }
  if (n < 0x10) {
    uVar4 = *(undefined8 *)src;
    uVar5 = *(undefined8 *)(src + (n - 8));
    dst[7] = '\0';
    dst[8] = '\0';
    dst[9] = '\0';
    dst[10] = '\0';
    dst[0xb] = '\0';
    dst[0xc] = '\0';
    dst[0xd] = '\0';
    dst[0xe] = '\0';
    *(undefined8 *)dst = uVar4;
    *(undefined8 *)(dst + (n - 8)) = uVar5;
    return;
  }
  __assert_fail("n <= 15",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/cord_internal.h"
                ,0x62,
                "void absl::cord_internal::SmallMemmove(char *, const char *, size_t) [nullify_tail = true]"
               );
}

Assistant:

inline void SmallMemmove(char* dst, const char* src, size_t n) {
  if (n >= 8) {
    assert(n <= 15);
    uint64_t buf1;
    uint64_t buf2;
    memcpy(&buf1, src, 8);
    memcpy(&buf2, src + n - 8, 8);
    if (nullify_tail) {
      memset(dst + 7, 0, 8);
    }
    // GCC 12 has a false-positive -Wstringop-overflow warning here.
#if ABSL_INTERNAL_HAVE_MIN_GNUC_VERSION(12, 0)
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wstringop-overflow"
#endif
    memcpy(dst, &buf1, 8);
    memcpy(dst + n - 8, &buf2, 8);
#if ABSL_INTERNAL_HAVE_MIN_GNUC_VERSION(12, 0)
#pragma GCC diagnostic pop
#endif
  } else if (n >= 4) {
    uint32_t buf1;
    uint32_t buf2;
    memcpy(&buf1, src, 4);
    memcpy(&buf2, src + n - 4, 4);
    if (nullify_tail) {
      memset(dst + 4, 0, 4);
      memset(dst + 7, 0, 8);
    }
    memcpy(dst, &buf1, 4);
    memcpy(dst + n - 4, &buf2, 4);
  } else {
    if (n != 0) {
      dst[0] = src[0];
      dst[n / 2] = src[n / 2];
      dst[n - 1] = src[n - 1];
    }
    if (nullify_tail) {
      memset(dst + 7, 0, 8);
      memset(dst + n, 0, 8);
    }
  }
}